

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Type.cpp
# Opt level: O0

size_t __thiscall slang::ast::Type::hash(Type *this)

{
  bool bVar1;
  Type *this_00;
  Type *pTVar2;
  FixedSizeUnpackedArrayType *pFVar3;
  int rest;
  AssociativeArrayType *pAVar4;
  int *in_RDI;
  VirtualInterfaceType *vi;
  QueueType *qt;
  AssociativeArrayType *aat;
  DPIOpenArrayType *dat_1;
  DynamicArrayType *dat;
  FixedSizeUnpackedArrayType *uat;
  IntegralType *it;
  Kind fk;
  Kind sk;
  Type *ct;
  size_t h;
  Type *in_stack_ffffffffffffff68;
  Type *in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff78;
  int32_t iVar5;
  undefined4 in_stack_ffffffffffffff7c;
  size_t *in_stack_ffffffffffffff80;
  
  this_00 = (Type *)(long)*in_RDI;
  pTVar2 = getCanonicalType(in_stack_ffffffffffffff70);
  bVar1 = isScalar((Type *)0x82232c);
  if (bVar1) {
    Symbol::as<slang::ast::ScalarType>((Symbol *)0x82233f);
    hash_combine<slang::ast::ScalarType::Kind>
              ((size_t *)in_stack_ffffffffffffff70,(Kind *)in_stack_ffffffffffffff68);
  }
  else {
    bVar1 = isFloating((Type *)0x822379);
    if (bVar1) {
      Symbol::as<slang::ast::FloatingType>((Symbol *)0x82238c);
      hash_combine<slang::ast::FloatingType::Kind>
                ((size_t *)in_stack_ffffffffffffff70,(Kind *)in_stack_ffffffffffffff68);
    }
    else {
      bVar1 = isIntegral(in_stack_ffffffffffffff70);
      if (bVar1) {
        Symbol::as<slang::ast::IntegralType>((Symbol *)0x8223d9);
        hash_combine<bool,bool,unsigned_int>
                  (in_stack_ffffffffffffff80,
                   (bool *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),
                   SUB81((ulong)in_stack_ffffffffffffff70 >> 0x38,0),(uint)in_stack_ffffffffffffff70
                  );
      }
      else if ((pTVar2->super_Symbol).kind == FixedSizeUnpackedArrayType) {
        pFVar3 = Symbol::as<slang::ast::FixedSizeUnpackedArrayType>((Symbol *)0x822428);
        rest = (int)((ulong)&pFVar3->range >> 0x20);
        iVar5 = (pFVar3->range).right;
        hash(this_00);
        hash_combine<int,int,unsigned_long>
                  (in_stack_ffffffffffffff80,(int *)CONCAT44(in_stack_ffffffffffffff7c,iVar5),rest,
                   (unsigned_long)in_stack_ffffffffffffff68);
      }
      else if ((pTVar2->super_Symbol).kind == DynamicArrayType) {
        Symbol::as<slang::ast::DynamicArrayType>((Symbol *)0x82248d);
        hash(this_00);
        hash_combine<unsigned_long>
                  ((size_t *)in_stack_ffffffffffffff70,(unsigned_long *)in_stack_ffffffffffffff68);
      }
      else if ((pTVar2->super_Symbol).kind == DPIOpenArrayType) {
        Symbol::as<slang::ast::DPIOpenArrayType>((Symbol *)0x8224d6);
        hash(this_00);
        hash_combine<bool,unsigned_long>
                  (in_stack_ffffffffffffff80,
                   (bool *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),
                   (unsigned_long)in_stack_ffffffffffffff70);
      }
      else if ((pTVar2->super_Symbol).kind == AssociativeArrayType) {
        pAVar4 = Symbol::as<slang::ast::AssociativeArrayType>((Symbol *)0x822529);
        hash(this_00);
        hash_combine<unsigned_long>
                  ((size_t *)in_stack_ffffffffffffff70,(unsigned_long *)in_stack_ffffffffffffff68);
        if (pAVar4->indexType != (Type *)0x0) {
          hash(this_00);
          hash_combine<unsigned_long>
                    ((size_t *)in_stack_ffffffffffffff70,(unsigned_long *)in_stack_ffffffffffffff68)
          ;
        }
      }
      else if ((pTVar2->super_Symbol).kind == QueueType) {
        Symbol::as<slang::ast::QueueType>((Symbol *)0x8225a3);
        hash(this_00);
        hash_combine<unsigned_long,unsigned_int>
                  ((size_t *)in_stack_ffffffffffffff70,(unsigned_long *)in_stack_ffffffffffffff68,0)
        ;
      }
      else if ((pTVar2->super_Symbol).kind == VirtualInterfaceType) {
        Symbol::as<slang::ast::VirtualInterfaceType>((Symbol *)0x8225f1);
        hash_combine<slang::ast::InstanceSymbol_const*>
                  ((size_t *)in_stack_ffffffffffffff70,(InstanceSymbol **)in_stack_ffffffffffffff68)
        ;
        hash_combine<slang::ast::ModportSymbol_const*>
                  ((size_t *)in_stack_ffffffffffffff70,(ModportSymbol **)in_stack_ffffffffffffff68);
      }
      else {
        this_00 = (Type *)hash<const_slang::ast::Type_*,_void>::operator()
                                    ((hash<const_slang::ast::Type_*,_void> *)
                                     in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
      }
    }
  }
  return (size_t)this_00;
}

Assistant:

size_t Type::hash() const {
    size_t h = size_t(kind);
    auto& ct = getCanonicalType();
    if (ct.isScalar()) {
        auto sk = ct.as<ScalarType>().scalarKind;
        if (sk == ScalarType::Reg)
            sk = ScalarType::Logic;
        hash_combine(h, sk);
    }
    else if (ct.isFloating()) {
        auto fk = ct.as<FloatingType>().floatKind;
        if (fk == FloatingType::RealTime)
            fk = FloatingType::Real;
        hash_combine(h, fk);
    }
    else if (ct.isIntegral()) {
        auto& it = ct.as<IntegralType>();
        hash_combine(h, it.isSigned, it.isFourState, it.bitWidth);
    }
    else if (ct.kind == SymbolKind::FixedSizeUnpackedArrayType) {
        auto& uat = ct.as<FixedSizeUnpackedArrayType>();
        hash_combine(h, uat.range.left, uat.range.right, uat.elementType.hash());
    }
    else if (ct.kind == SymbolKind::DynamicArrayType) {
        auto& dat = ct.as<DynamicArrayType>();
        hash_combine(h, dat.elementType.hash());
    }
    else if (ct.kind == SymbolKind::DPIOpenArrayType) {
        auto& dat = ct.as<DPIOpenArrayType>();
        hash_combine(h, dat.isPacked, dat.elementType.hash());
    }
    else if (ct.kind == SymbolKind::AssociativeArrayType) {
        auto& aat = ct.as<AssociativeArrayType>();
        hash_combine(h, aat.elementType.hash());
        if (aat.indexType)
            hash_combine(h, aat.indexType->hash());
    }
    else if (ct.kind == SymbolKind::QueueType) {
        auto& qt = ct.as<QueueType>();
        hash_combine(h, qt.elementType.hash(), qt.maxBound);
    }
    else if (ct.kind == SymbolKind::VirtualInterfaceType) {
        auto& vi = ct.as<VirtualInterfaceType>();
        hash_combine(h, &vi.iface);
        hash_combine(h, vi.modport);
    }
    else {
        h = (size_t)slang::hash<const Type*>()(&ct);
    }
    return h;
}